

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O2

void skiwi::compile_apply(asmcode *code,compiler_options *ops)

{
  skiwi *psVar1;
  uint64_t in_RDX;
  uint64_t lab;
  uint64_t lab_00;
  uint64_t lab_01;
  uint64_t lab_02;
  uint64_t lab_03;
  uint64_t lab_04;
  uint64_t lab_05;
  uint64_t lab_06;
  uint64_t lab_07;
  uint64_t lab_08;
  uint64_t lab_09;
  uint64_t lab_10;
  operand oVar2;
  operand local_1e4;
  operand local_1e0 [2];
  string all_args_set;
  string rep_arg_set;
  string rep_arg_set_clos;
  operand local_174;
  string rep_arg_set_clos_done;
  string all_args_set_clos;
  string rep_arg_set_done;
  operand local_10c;
  string unravel;
  string repeat;
  string unraveled;
  string done;
  string error;
  string proc;
  string clos;
  
  psVar1 = label;
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  label = label + 1;
  label_to_string_abi_cxx11_(&proc,psVar1,in_RDX);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&clos,psVar1,lab);
  psVar1 = label;
  if (ops->safe_primitives == true) {
    label = label + 1;
    label_to_string_abi_cxx11_(&repeat,psVar1,lab_00);
    std::__cxx11::string::operator=((string *)&error,(string *)&repeat);
    std::__cxx11::string::~string((string *)&repeat);
    repeat._M_dataplus._M_p._0_4_ = 5;
    done._M_dataplus._M_p._0_4_ = 0x14;
    unravel._M_dataplus._M_p._0_4_ = 0x39;
    unraveled._M_dataplus._M_p._0_4_ = 2;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&repeat,(operand *)&done,(operand *)&unravel,(int *)&unraveled);
    repeat._M_dataplus._M_p._0_4_ = 0x30;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&repeat,&error);
  }
  repeat._M_dataplus._M_p._0_4_ = 0x40;
  done._M_dataplus._M_p._0_4_ = 9;
  unravel._M_dataplus._M_p._0_4_ = 0x23;
  unraveled._M_dataplus._M_p._0_4_ = 0xa0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&repeat,(operand *)&done,(operand *)&unravel,(int *)&unraveled);
  repeat._M_dataplus._M_p._0_4_ = 0x40;
  done._M_dataplus._M_p._0_4_ = 0x19;
  unravel._M_dataplus._M_p._0_4_ = 0xb;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&repeat,(operand *)&done,(operand *)&unravel);
  repeat._M_dataplus._M_p._0_4_ = 0x40;
  done._M_dataplus._M_p._0_4_ = 0x19;
  unravel._M_dataplus._M_p._0_4_ = 8;
  unraveled._M_dataplus._M_p._0_4_ = 0xc;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,(operation *)&repeat,(operand *)&done,(int *)&unravel,(operand *)&unraveled);
  repeat._M_dataplus._M_p._0_4_ = 0x40;
  done._M_dataplus._M_p._0_4_ = 0x19;
  unravel._M_dataplus._M_p._0_4_ = 0x10;
  unraveled._M_dataplus._M_p._0_4_ = 0xd;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,(operation *)&repeat,(operand *)&done,(int *)&unravel,(operand *)&unraveled);
  repeat._M_dataplus._M_p._0_4_ = 0x40;
  done._M_dataplus._M_p._0_4_ = 0x19;
  unravel._M_dataplus._M_p._0_4_ = 0x18;
  unraveled._M_dataplus._M_p._0_4_ = 0xe;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,(operation *)&repeat,(operand *)&done,(int *)&unravel,(operand *)&unraveled);
  repeat._M_dataplus._M_p._0_4_ = 0x40;
  done._M_dataplus._M_p._0_4_ = 0x19;
  unravel._M_dataplus._M_p._0_4_ = 0x20;
  unraveled._M_dataplus._M_p._0_4_ = 0x11;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,(operation *)&repeat,(operand *)&done,(int *)&unravel,(operand *)&unraveled);
  repeat._M_dataplus._M_p._0_4_ = 0x40;
  done._M_dataplus._M_p._0_4_ = 0x19;
  unravel._M_dataplus._M_p._0_4_ = 0x28;
  unraveled._M_dataplus._M_p._0_4_ = 0x12;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,(operation *)&repeat,(operand *)&done,(int *)&unravel,(operand *)&unraveled);
  repeat._M_dataplus._M_p._0_4_ = 0x40;
  done._M_dataplus._M_p._0_4_ = 0x19;
  unravel._M_dataplus._M_p._0_4_ = 0x30;
  unraveled._M_dataplus._M_p._0_4_ = 0x15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,(operation *)&repeat,(operand *)&done,(int *)&unravel,(operand *)&unraveled);
  repeat._M_dataplus._M_p._0_4_ = 0x40;
  done._M_dataplus._M_p._0_4_ = 0x19;
  unravel._M_dataplus._M_p._0_4_ = 0x38;
  unraveled._M_dataplus._M_p._0_4_ = 0x17;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,(operation *)&repeat,(operand *)&done,(int *)&unravel,(operand *)&unraveled);
  repeat._M_dataplus._M_p._0_4_ = 0x40;
  done._M_dataplus._M_p._0_4_ = 0xc;
  unravel._M_dataplus._M_p._0_4_ = 0x14;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&repeat,(operand *)&done,(operand *)&unravel);
  repeat._M_dataplus._M_p._0_4_ = 0;
  done._M_dataplus._M_p._0_4_ = 9;
  unravel._M_dataplus._M_p._0_4_ = 0x39;
  unraveled._M_dataplus._M_p._0_4_ = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&repeat,(operand *)&done,(operand *)&unravel,(int *)&unraveled);
  repeat._M_dataplus._M_p._0_4_ = 0x58;
  done._M_dataplus._M_p._0_4_ = 0x14;
  unravel._M_dataplus._M_p._0_4_ = 0x39;
  unraveled._M_dataplus._M_p._0_4_ = 2;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&repeat,(operand *)&done,(operand *)&unravel,(int *)&unraveled);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&repeat,psVar1,lab_01);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&done,psVar1,lab_02);
  unravel._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&unravel,&repeat);
  unravel._M_dataplus._M_p._0_4_ = 5;
  unraveled._M_dataplus._M_p._0_4_ = 0x14;
  all_args_set_clos._M_dataplus._M_p._0_4_ = 0x39;
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&unravel,(operand *)&unraveled,(operand *)&all_args_set_clos,
             (int *)&rep_arg_set_clos);
  unravel._M_dataplus._M_p._0_4_ = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&unravel,&done);
  unravel._M_dataplus._M_p._0_4_ = 0xd;
  unraveled._M_dataplus._M_p._0_4_ = 0x14;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&unravel,(operand *)&unraveled);
  unravel._M_dataplus._M_p._0_4_ = 0;
  unraveled._M_dataplus._M_p._0_4_ = 9;
  all_args_set_clos._M_dataplus._M_p._0_4_ = 0x39;
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&unravel,(operand *)&unraveled,(operand *)&all_args_set_clos,
             (int *)&rep_arg_set_clos);
  unravel._M_dataplus._M_p._0_4_ = 0x35;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&unravel,&repeat);
  unravel._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&unravel,&done);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&unravel,psVar1,lab_03);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&unraveled,psVar1,lab_04);
  all_args_set_clos._M_dataplus._M_p._0_4_ = 0x40;
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0x14;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0xc;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&all_args_set_clos,(operand *)&rep_arg_set_clos,
             (operand *)&rep_arg_set_clos_done);
  all_args_set_clos._M_dataplus._M_p._0_4_ = 0x58;
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0x14;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0x39;
  all_args_set._M_dataplus._M_p._0_4_ = 2;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&all_args_set_clos,(operand *)&rep_arg_set_clos,
             (operand *)&rep_arg_set_clos_done,(int *)&all_args_set);
  all_args_set_clos._M_dataplus._M_p._0_4_ = 0x40;
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0x18;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0x19;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&all_args_set_clos,(operand *)&rep_arg_set_clos,
             (operand *)&rep_arg_set_clos_done);
  all_args_set_clos._M_dataplus._M_p._0_4_ = 5;
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0x18;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0x39;
  all_args_set._M_dataplus._M_p._0_4_ = 0x1f;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&all_args_set_clos,(operand *)&rep_arg_set_clos,
             (operand *)&rep_arg_set_clos_done,(int *)&all_args_set);
  all_args_set_clos._M_dataplus._M_p._0_4_ = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&all_args_set_clos,&unraveled);
  if (ops->safe_primitives == true) {
    jump_if_arg_is_not_block(code,R15,RDX,&error);
  }
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 2;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0x18;
  all_args_set._M_dataplus._M_p._0_4_ = 0x39;
  all_args_set_clos._M_dataplus._M_p = (pointer)0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,(operation *)&rep_arg_set_clos,(operand *)&rep_arg_set_clos_done,
             (operand *)&all_args_set,(unsigned_long *)&all_args_set_clos);
  if (ops->safe_primitives == true) {
    jump_if_arg_does_not_point_to_pair(code,R15,RDX,&error);
  }
  all_args_set_clos._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&all_args_set_clos,&unravel);
  all_args_set_clos._M_dataplus._M_p._0_4_ = 0x40;
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0xc;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0x28;
  all_args_set._M_dataplus._M_p._0_4_ = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&all_args_set_clos,(operand *)&rep_arg_set_clos,
             (operand *)&rep_arg_set_clos_done,(int *)&all_args_set);
  all_args_set_clos._M_dataplus._M_p._0_4_ = 0x40;
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0x19;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0xc;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&all_args_set_clos,(operand *)&rep_arg_set_clos,
             (operand *)&rep_arg_set_clos_done);
  all_args_set_clos._M_dataplus._M_p._0_4_ = 0x2b;
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0x14;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&all_args_set_clos,(operand *)&rep_arg_set_clos);
  all_args_set_clos._M_dataplus._M_p._0_4_ = 0x40;
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0xc;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0x28;
  all_args_set._M_dataplus._M_p._0_4_ = 0x10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&all_args_set_clos,(operand *)&rep_arg_set_clos,
             (operand *)&rep_arg_set_clos_done,(int *)&all_args_set);
  all_args_set_clos._M_dataplus._M_p._0_4_ = 5;
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0xc;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0x39;
  all_args_set._M_dataplus._M_p._0_4_ = 0x1f;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&all_args_set_clos,(operand *)&rep_arg_set_clos,
             (operand *)&rep_arg_set_clos_done,(int *)&all_args_set);
  all_args_set_clos._M_dataplus._M_p._0_4_ = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&all_args_set_clos,&unraveled);
  if (ops->safe_primitives == true) {
    jump_if_arg_is_not_block(code,RDX,R15,&error);
  }
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 2;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0xc;
  all_args_set._M_dataplus._M_p._0_4_ = 0x39;
  all_args_set_clos._M_dataplus._M_p = (pointer)0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,(operation *)&rep_arg_set_clos,(operand *)&rep_arg_set_clos_done,
             (operand *)&all_args_set,(unsigned_long *)&all_args_set_clos);
  if (ops->safe_primitives == true) {
    jump_if_arg_does_not_point_to_pair(code,RDX,R15,&error);
  }
  all_args_set_clos._M_dataplus._M_p._0_4_ = 0x40;
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0x18;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0xc;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&all_args_set_clos,(operand *)&rep_arg_set_clos,
             (operand *)&rep_arg_set_clos_done);
  all_args_set_clos._M_dataplus._M_p = all_args_set_clos._M_dataplus._M_p & 0xffffffff00000000;
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 9;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0x39;
  all_args_set._M_dataplus._M_p._0_4_ = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&all_args_set_clos,(operand *)&rep_arg_set_clos,
             (operand *)&rep_arg_set_clos_done,(int *)&all_args_set);
  all_args_set_clos._M_dataplus._M_p._0_4_ = 0x35;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&all_args_set_clos,&unravel);
  all_args_set_clos._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&all_args_set_clos,&unraveled);
  all_args_set_clos._M_dataplus._M_p._0_4_ = 0x40;
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 9;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0xb;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&all_args_set_clos,(operand *)&rep_arg_set_clos,
             (operand *)&rep_arg_set_clos_done);
  all_args_set_clos._M_dataplus._M_p._0_4_ = 2;
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 9;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0x39;
  all_args_set._M_dataplus._M_p._0_4_ = 7;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&all_args_set_clos,(operand *)&rep_arg_set_clos,
             (operand *)&rep_arg_set_clos_done,(int *)&all_args_set);
  all_args_set_clos._M_dataplus._M_p._0_4_ = 5;
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 9;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0x39;
  all_args_set._M_dataplus._M_p._0_4_ = 3;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&all_args_set_clos,(operand *)&rep_arg_set_clos,
             (operand *)&rep_arg_set_clos_done,(int *)&all_args_set);
  all_args_set_clos._M_dataplus._M_p._0_4_ = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&all_args_set_clos,&proc);
  if (ops->safe_primitives == true) {
    jump_if_arg_is_not_block(code,RCX,R15,&error);
    rep_arg_set_clos._M_dataplus._M_p._0_4_ = 2;
    rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0xb;
    all_args_set._M_dataplus._M_p._0_4_ = 0x39;
    all_args_set_clos._M_dataplus._M_p = (pointer)0xfffffffffffffff8;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
              (code,(operation *)&rep_arg_set_clos,(operand *)&rep_arg_set_clos_done,
               (operand *)&all_args_set,(unsigned_long *)&all_args_set_clos);
    jump_if_arg_does_not_point_to_closure(code,RCX,R15,&error);
    all_args_set_clos._M_dataplus._M_p._0_4_ = 0x49;
    rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0xb;
    rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0x39;
    all_args_set._M_dataplus._M_p._0_4_ = 5;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&all_args_set_clos,(operand *)&rep_arg_set_clos,
               (operand *)&rep_arg_set_clos_done,(int *)&all_args_set);
  }
  all_args_set_clos._M_dataplus._M_p._0_4_ = 0x40;
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 9;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0x39;
  all_args_set._M_dataplus._M_p._0_4_ = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&all_args_set_clos,(operand *)&rep_arg_set_clos,
             (operand *)&rep_arg_set_clos_done,(int *)&all_args_set);
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0x40;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0x18;
  all_args_set._M_dataplus._M_p._0_4_ = 0x39;
  all_args_set_clos._M_dataplus._M_p = (pointer)0x400000000000000;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,(operation *)&rep_arg_set_clos,(operand *)&rep_arg_set_clos_done,
             (operand *)&all_args_set,(unsigned_long *)&all_args_set_clos);
  all_args_set_clos._M_dataplus._M_p._0_4_ = 0x49;
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 9;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0x18;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&all_args_set_clos,(operand *)&rep_arg_set_clos,
             (operand *)&rep_arg_set_clos_done);
  all_args_set_clos._M_dataplus._M_p._0_4_ = 0x40;
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0x20;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 9;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&all_args_set_clos,(operand *)&rep_arg_set_clos,
             (operand *)&rep_arg_set_clos_done);
  all_args_set_clos._M_dataplus._M_p._0_4_ = 0x40;
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0x18;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0x42;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,char_const(&)[11]>
            (code,(operation *)&all_args_set_clos,(operand *)&rep_arg_set_clos,
             (operand *)&rep_arg_set_clos_done,(char (*) [11])"L_identity");
  all_args_set_clos._M_dataplus._M_p._0_4_ = 0x40;
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0x20;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 8;
  all_args_set._M_dataplus._M_p._0_4_ = 0x18;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,(operation *)&all_args_set_clos,(operand *)&rep_arg_set_clos,
             (int *)&rep_arg_set_clos_done,(operand *)&all_args_set);
  all_args_set_clos._M_dataplus._M_p._0_4_ = 0x40;
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0x18;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0x10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&all_args_set_clos,(operand *)&rep_arg_set_clos,
             (operand *)&rep_arg_set_clos_done);
  all_args_set_clos._M_dataplus._M_p._0_4_ = 0x49;
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0x18;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0x39;
  all_args_set._M_dataplus._M_p._0_4_ = 5;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&all_args_set_clos,(operand *)&rep_arg_set_clos,
             (operand *)&rep_arg_set_clos_done,(int *)&all_args_set);
  all_args_set_clos._M_dataplus._M_p = all_args_set_clos._M_dataplus._M_p & 0xffffffff00000000;
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0x10;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0x39;
  all_args_set._M_dataplus._M_p._0_4_ = 0x10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&all_args_set_clos,(operand *)&rep_arg_set_clos,
             (operand *)&rep_arg_set_clos_done,(int *)&all_args_set);
  all_args_set_clos._M_dataplus._M_p._0_4_ = 0x40;
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0xc;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0x18;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&all_args_set_clos,(operand *)&rep_arg_set_clos,
             (operand *)&rep_arg_set_clos_done);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&all_args_set_clos,psVar1,lab_05);
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 5;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0x14;
  all_args_set._M_dataplus._M_p._0_4_ = 0x39;
  rep_arg_set._M_dataplus._M_p._0_4_ = 0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&rep_arg_set_clos,(operand *)&rep_arg_set_clos_done,
             (operand *)&all_args_set,(int *)&rep_arg_set);
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&rep_arg_set_clos,&all_args_set_clos);
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0x40;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 9;
  all_args_set._M_dataplus._M_p._0_4_ = 0x23;
  rep_arg_set._M_dataplus._M_p._0_4_ = 0xa0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&rep_arg_set_clos,(operand *)&rep_arg_set_clos_done,
             (operand *)&all_args_set,(int *)&rep_arg_set);
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 9;
  all_args_set._M_dataplus._M_p._0_4_ = 0x39;
  rep_arg_set._M_dataplus._M_p._0_4_ = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&rep_arg_set_clos,(operand *)&rep_arg_set_clos_done,
             (operand *)&all_args_set,(int *)&rep_arg_set);
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0x40;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0xd;
  all_args_set._M_dataplus._M_p._0_4_ = 0x19;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&rep_arg_set_clos,(operand *)&rep_arg_set_clos_done,
             (operand *)&all_args_set);
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 5;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0x14;
  all_args_set._M_dataplus._M_p._0_4_ = 0x39;
  rep_arg_set._M_dataplus._M_p._0_4_ = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&rep_arg_set_clos,(operand *)&rep_arg_set_clos_done,
             (operand *)&all_args_set,(int *)&rep_arg_set);
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&rep_arg_set_clos,&all_args_set_clos);
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 9;
  all_args_set._M_dataplus._M_p._0_4_ = 0x39;
  rep_arg_set._M_dataplus._M_p._0_4_ = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&rep_arg_set_clos,(operand *)&rep_arg_set_clos_done,
             (operand *)&all_args_set,(int *)&rep_arg_set);
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0x40;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0xe;
  all_args_set._M_dataplus._M_p._0_4_ = 0x19;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&rep_arg_set_clos,(operand *)&rep_arg_set_clos_done,
             (operand *)&all_args_set);
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 5;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0x14;
  all_args_set._M_dataplus._M_p._0_4_ = 0x39;
  rep_arg_set._M_dataplus._M_p._0_4_ = 2;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&rep_arg_set_clos,(operand *)&rep_arg_set_clos_done,
             (operand *)&all_args_set,(int *)&rep_arg_set);
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&rep_arg_set_clos,&all_args_set_clos);
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 9;
  all_args_set._M_dataplus._M_p._0_4_ = 0x39;
  rep_arg_set._M_dataplus._M_p._0_4_ = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&rep_arg_set_clos,(operand *)&rep_arg_set_clos_done,
             (operand *)&all_args_set,(int *)&rep_arg_set);
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0x40;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0x11;
  all_args_set._M_dataplus._M_p._0_4_ = 0x19;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&rep_arg_set_clos,(operand *)&rep_arg_set_clos_done,
             (operand *)&all_args_set);
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 5;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0x14;
  all_args_set._M_dataplus._M_p._0_4_ = 0x39;
  rep_arg_set._M_dataplus._M_p._0_4_ = 3;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&rep_arg_set_clos,(operand *)&rep_arg_set_clos_done,
             (operand *)&all_args_set,(int *)&rep_arg_set);
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&rep_arg_set_clos,&all_args_set_clos);
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 9;
  all_args_set._M_dataplus._M_p._0_4_ = 0x39;
  rep_arg_set._M_dataplus._M_p._0_4_ = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&rep_arg_set_clos,(operand *)&rep_arg_set_clos_done,
             (operand *)&all_args_set,(int *)&rep_arg_set);
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0x40;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0x12;
  all_args_set._M_dataplus._M_p._0_4_ = 0x19;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&rep_arg_set_clos,(operand *)&rep_arg_set_clos_done,
             (operand *)&all_args_set);
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 5;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0x14;
  all_args_set._M_dataplus._M_p._0_4_ = 0x39;
  rep_arg_set._M_dataplus._M_p._0_4_ = 4;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&rep_arg_set_clos,(operand *)&rep_arg_set_clos_done,
             (operand *)&all_args_set,(int *)&rep_arg_set);
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&rep_arg_set_clos,&all_args_set_clos);
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 9;
  all_args_set._M_dataplus._M_p._0_4_ = 0x39;
  rep_arg_set._M_dataplus._M_p._0_4_ = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&rep_arg_set_clos,(operand *)&rep_arg_set_clos_done,
             (operand *)&all_args_set,(int *)&rep_arg_set);
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0x40;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0x15;
  all_args_set._M_dataplus._M_p._0_4_ = 0x19;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&rep_arg_set_clos,(operand *)&rep_arg_set_clos_done,
             (operand *)&all_args_set);
  oVar2 = CL;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0x14;
  all_args_set._M_dataplus._M_p._0_4_ = 0x39;
  rep_arg_set._M_dataplus._M_p._0_4_ = oVar2;
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = oVar2;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&rep_arg_set_clos,(operand *)&rep_arg_set_clos_done,
             (operand *)&all_args_set,(int *)&rep_arg_set);
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&rep_arg_set_clos,&all_args_set_clos);
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 9;
  all_args_set._M_dataplus._M_p._0_4_ = 0x39;
  rep_arg_set._M_dataplus._M_p._0_4_ = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&rep_arg_set_clos,(operand *)&rep_arg_set_clos_done,
             (operand *)&all_args_set,(int *)&rep_arg_set);
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0x40;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0x17;
  all_args_set._M_dataplus._M_p._0_4_ = 0x19;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&rep_arg_set_clos,(operand *)&rep_arg_set_clos_done,
             (operand *)&all_args_set);
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 5;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0x14;
  all_args_set._M_dataplus._M_p._0_4_ = 0x39;
  rep_arg_set._M_dataplus._M_p._0_4_ = 6;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&rep_arg_set_clos,(operand *)&rep_arg_set_clos_done,
             (operand *)&all_args_set,(int *)&rep_arg_set);
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&rep_arg_set_clos,&all_args_set_clos);
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0x4b;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0x14;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&rep_arg_set_clos,(operand *)&rep_arg_set_clos_done);
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0x58;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0x14;
  all_args_set._M_dataplus._M_p._0_4_ = 0x39;
  rep_arg_set._M_dataplus._M_p._0_4_ = 6;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&rep_arg_set_clos,(operand *)&rep_arg_set_clos_done,
             (operand *)&all_args_set,(int *)&rep_arg_set);
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0x40;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0x18;
  all_args_set._M_dataplus._M_p._0_4_ = 0x23;
  rep_arg_set._M_dataplus._M_p._0_4_ = 0x88;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&rep_arg_set_clos,(operand *)&rep_arg_set_clos_done,
             (operand *)&all_args_set,(int *)&rep_arg_set);
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0x55;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0x14;
  all_args_set._M_dataplus._M_p._0_4_ = 0x39;
  rep_arg_set._M_dataplus._M_p._0_4_ = 3;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&rep_arg_set_clos,(operand *)&rep_arg_set_clos_done,
             (operand *)&all_args_set,(int *)&rep_arg_set);
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0x18;
  all_args_set._M_dataplus._M_p._0_4_ = 0x14;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&rep_arg_set_clos,(operand *)&rep_arg_set_clos_done,
             (operand *)&all_args_set);
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 9;
  all_args_set._M_dataplus._M_p._0_4_ = 0x14;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&rep_arg_set_clos,(operand *)&rep_arg_set_clos_done,
             (operand *)&all_args_set);
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0x56;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0x14;
  all_args_set._M_dataplus._M_p._0_4_ = 0x39;
  rep_arg_set._M_dataplus._M_p._0_4_ = 3;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&rep_arg_set_clos,(operand *)&rep_arg_set_clos_done,
             (operand *)&all_args_set,(int *)&rep_arg_set);
  rep_arg_set_clos._M_dataplus._M_p._0_4_ = 0x4b;
  rep_arg_set_clos_done._M_dataplus._M_p._0_4_ = 0xb;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&rep_arg_set_clos,(operand *)&rep_arg_set_clos_done);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&rep_arg_set_clos,psVar1,lab_06);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&rep_arg_set_clos_done,psVar1,lab_07);
  all_args_set._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&all_args_set,&rep_arg_set_clos);
  all_args_set._M_dataplus._M_p._0_4_ = 0x58;
  rep_arg_set._M_dataplus._M_p._0_4_ = 0x18;
  rep_arg_set_done._M_dataplus._M_p._0_4_ = 0x39;
  local_1e0[0] = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&all_args_set,(operand *)&rep_arg_set,(operand *)&rep_arg_set_done,
             (int *)local_1e0);
  all_args_set._M_dataplus._M_p._0_4_ = 0x40;
  rep_arg_set._M_dataplus._M_p._0_4_ = 0xb;
  rep_arg_set_done._M_dataplus._M_p._0_4_ = 0x19;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&all_args_set,(operand *)&rep_arg_set,(operand *)&rep_arg_set_done);
  all_args_set._M_dataplus._M_p._0_4_ = 0x40;
  rep_arg_set._M_dataplus._M_p._0_4_ = 0x28;
  rep_arg_set_done._M_dataplus._M_p._0_4_ = 0xb;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&all_args_set,(operand *)&rep_arg_set,(operand *)&rep_arg_set_done);
  all_args_set._M_dataplus._M_p._0_4_ = 0x58;
  rep_arg_set._M_dataplus._M_p._0_4_ = 9;
  rep_arg_set_done._M_dataplus._M_p._0_4_ = 0x39;
  local_1e0[0] = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&all_args_set,(operand *)&rep_arg_set,(operand *)&rep_arg_set_done,
             (int *)local_1e0);
  all_args_set._M_dataplus._M_p._0_4_ = 0xd;
  rep_arg_set._M_dataplus._M_p._0_4_ = 0x14;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&all_args_set,(operand *)&rep_arg_set);
  all_args_set._M_dataplus._M_p._0_4_ = 5;
  rep_arg_set._M_dataplus._M_p._0_4_ = 0x14;
  rep_arg_set_done._M_dataplus._M_p._0_4_ = 0x39;
  local_1e0[0] = EMPTY;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&all_args_set,(operand *)&rep_arg_set,(operand *)&rep_arg_set_done,
             (int *)local_1e0);
  all_args_set._M_dataplus._M_p._0_4_ = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&all_args_set,&rep_arg_set_clos_done);
  all_args_set._M_dataplus._M_p._0_4_ = 0x35;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&all_args_set,&rep_arg_set_clos);
  all_args_set._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&all_args_set,&rep_arg_set_clos_done);
  all_args_set._M_dataplus._M_p._0_4_ = 0x4a;
  rep_arg_set._M_dataplus._M_p._0_4_ = 0xb;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&all_args_set,(operand *)&rep_arg_set);
  all_args_set._M_dataplus._M_p._0_4_ = 0x4a;
  rep_arg_set._M_dataplus._M_p._0_4_ = 0x14;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&all_args_set,(operand *)&rep_arg_set);
  all_args_set._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&all_args_set,&all_args_set_clos);
  all_args_set._M_dataplus._M_p = all_args_set._M_dataplus._M_p & 0xffffffff00000000;
  rep_arg_set._M_dataplus._M_p._0_4_ = 0x14;
  rep_arg_set_done._M_dataplus._M_p._0_4_ = 0x39;
  local_1e0[0] = AH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&all_args_set,(operand *)&rep_arg_set,(operand *)&rep_arg_set_done,
             (int *)local_1e0);
  all_args_set._M_dataplus._M_p._0_4_ = 0x40;
  rep_arg_set._M_dataplus._M_p._0_4_ = 9;
  rep_arg_set_done._M_dataplus._M_p._0_4_ = 0xb;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&all_args_set,(operand *)&rep_arg_set,(operand *)&rep_arg_set_done);
  rep_arg_set._M_dataplus._M_p._0_4_ = 2;
  rep_arg_set_done._M_dataplus._M_p._0_4_ = 9;
  local_1e0[0] = NUMBER;
  all_args_set._M_dataplus._M_p = (pointer)0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,(operation *)&rep_arg_set,(operand *)&rep_arg_set_done,local_1e0,
             (unsigned_long *)&all_args_set);
  all_args_set._M_dataplus._M_p._0_4_ = 0x40;
  rep_arg_set._M_dataplus._M_p._0_4_ = 0x18;
  rep_arg_set_done._M_dataplus._M_p._0_4_ = 0x19;
  local_1e0[0] = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&all_args_set,(operand *)&rep_arg_set,(operand *)&rep_arg_set_done,
             (int *)local_1e0);
  all_args_set._M_dataplus._M_p._0_4_ = 0x4b;
  rep_arg_set._M_dataplus._M_p._0_4_ = 10;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&all_args_set,(operand *)&rep_arg_set);
  all_args_set._M_dataplus._M_p._0_4_ = 0x2c;
  rep_arg_set._M_dataplus._M_p._0_4_ = 0x18;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&all_args_set,(operand *)&rep_arg_set);
  all_args_set._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,char_const(&)[23]>
            (code,(operation *)&all_args_set,(char (*) [23])"L_return_from_identity");
  all_args_set._M_dataplus._M_p._0_4_ = 0x4a;
  rep_arg_set._M_dataplus._M_p._0_4_ = 10;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&all_args_set,(operand *)&rep_arg_set);
  all_args_set._M_dataplus._M_p._0_4_ = 0x2c;
  rep_arg_set._M_dataplus._M_p._0_4_ = 10;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&all_args_set,(operand *)&rep_arg_set);
  all_args_set._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&all_args_set,&proc);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&all_args_set,psVar1,lab_08);
  rep_arg_set._M_dataplus._M_p._0_4_ = 5;
  rep_arg_set_done._M_dataplus._M_p._0_4_ = 0x14;
  local_1e0[0] = NUMBER;
  local_1e4 = EMPTY;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&rep_arg_set,(operand *)&rep_arg_set_done,local_1e0,(int *)&local_1e4
            );
  rep_arg_set._M_dataplus._M_p._0_4_ = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&rep_arg_set,&all_args_set);
  rep_arg_set._M_dataplus._M_p._0_4_ = 0x40;
  rep_arg_set_done._M_dataplus._M_p._0_4_ = 9;
  local_1e0[0] = MEM_R10;
  local_1e4 = 0xa0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&rep_arg_set,(operand *)&rep_arg_set_done,local_1e0,(int *)&local_1e4
            );
  rep_arg_set._M_dataplus._M_p._0_4_ = 0;
  rep_arg_set_done._M_dataplus._M_p._0_4_ = 9;
  local_1e0[0] = NUMBER;
  local_1e4 = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&rep_arg_set,(operand *)&rep_arg_set_done,local_1e0,(int *)&local_1e4
            );
  rep_arg_set._M_dataplus._M_p._0_4_ = 0x40;
  rep_arg_set_done._M_dataplus._M_p._0_4_ = 0xb;
  local_1e0[0] = MEM_RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&rep_arg_set,(operand *)&rep_arg_set_done,local_1e0);
  rep_arg_set._M_dataplus._M_p._0_4_ = 5;
  rep_arg_set_done._M_dataplus._M_p._0_4_ = 0x14;
  local_1e0[0] = NUMBER;
  local_1e4 = AL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&rep_arg_set,(operand *)&rep_arg_set_done,local_1e0,(int *)&local_1e4
            );
  rep_arg_set._M_dataplus._M_p._0_4_ = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&rep_arg_set,&all_args_set);
  rep_arg_set._M_dataplus._M_p._0_4_ = 0;
  rep_arg_set_done._M_dataplus._M_p._0_4_ = 9;
  local_1e0[0] = NUMBER;
  local_1e4 = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&rep_arg_set,(operand *)&rep_arg_set_done,local_1e0,(int *)&local_1e4
            );
  rep_arg_set._M_dataplus._M_p._0_4_ = 0x40;
  rep_arg_set_done._M_dataplus._M_p._0_4_ = 0xc;
  local_1e0[0] = MEM_RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&rep_arg_set,(operand *)&rep_arg_set_done,local_1e0);
  rep_arg_set._M_dataplus._M_p._0_4_ = 5;
  rep_arg_set_done._M_dataplus._M_p._0_4_ = 0x14;
  local_1e0[0] = NUMBER;
  local_1e4 = AH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&rep_arg_set,(operand *)&rep_arg_set_done,local_1e0,(int *)&local_1e4
            );
  rep_arg_set._M_dataplus._M_p._0_4_ = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&rep_arg_set,&all_args_set);
  rep_arg_set._M_dataplus._M_p._0_4_ = 0;
  rep_arg_set_done._M_dataplus._M_p._0_4_ = 9;
  local_1e0[0] = NUMBER;
  local_1e4 = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&rep_arg_set,(operand *)&rep_arg_set_done,local_1e0,(int *)&local_1e4
            );
  rep_arg_set._M_dataplus._M_p._0_4_ = 0x40;
  rep_arg_set_done._M_dataplus._M_p._0_4_ = 0xd;
  local_1e0[0] = MEM_RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&rep_arg_set,(operand *)&rep_arg_set_done,local_1e0);
  rep_arg_set._M_dataplus._M_p._0_4_ = 5;
  rep_arg_set_done._M_dataplus._M_p._0_4_ = 0x14;
  local_1e0[0] = NUMBER;
  local_1e4 = BL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&rep_arg_set,(operand *)&rep_arg_set_done,local_1e0,(int *)&local_1e4
            );
  rep_arg_set._M_dataplus._M_p._0_4_ = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&rep_arg_set,&all_args_set);
  rep_arg_set._M_dataplus._M_p._0_4_ = 0;
  rep_arg_set_done._M_dataplus._M_p._0_4_ = 9;
  local_1e0[0] = NUMBER;
  local_1e4 = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&rep_arg_set,(operand *)&rep_arg_set_done,local_1e0,(int *)&local_1e4
            );
  rep_arg_set._M_dataplus._M_p._0_4_ = 0x40;
  rep_arg_set_done._M_dataplus._M_p._0_4_ = 0xe;
  local_1e0[0] = MEM_RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&rep_arg_set,(operand *)&rep_arg_set_done,local_1e0);
  rep_arg_set._M_dataplus._M_p._0_4_ = 5;
  rep_arg_set_done._M_dataplus._M_p._0_4_ = 0x14;
  local_1e0[0] = NUMBER;
  local_1e4 = BH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&rep_arg_set,(operand *)&rep_arg_set_done,local_1e0,(int *)&local_1e4
            );
  rep_arg_set._M_dataplus._M_p._0_4_ = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&rep_arg_set,&all_args_set);
  rep_arg_set._M_dataplus._M_p._0_4_ = 0;
  rep_arg_set_done._M_dataplus._M_p._0_4_ = 9;
  local_1e0[0] = NUMBER;
  local_1e4 = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&rep_arg_set,(operand *)&rep_arg_set_done,local_1e0,(int *)&local_1e4
            );
  rep_arg_set._M_dataplus._M_p._0_4_ = 0x40;
  rep_arg_set_done._M_dataplus._M_p._0_4_ = 0x11;
  local_1e0[0] = MEM_RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&rep_arg_set,(operand *)&rep_arg_set_done,local_1e0);
  rep_arg_set_done._M_dataplus._M_p._0_4_ = 0x14;
  local_1e0[0] = NUMBER;
  local_1e4 = oVar2;
  rep_arg_set._M_dataplus._M_p._0_4_ = oVar2;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&rep_arg_set,(operand *)&rep_arg_set_done,local_1e0,(int *)&local_1e4
            );
  rep_arg_set._M_dataplus._M_p._0_4_ = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&rep_arg_set,&all_args_set);
  rep_arg_set._M_dataplus._M_p._0_4_ = 0;
  rep_arg_set_done._M_dataplus._M_p._0_4_ = 9;
  local_1e0[0] = NUMBER;
  local_1e4 = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&rep_arg_set,(operand *)&rep_arg_set_done,local_1e0,(int *)&local_1e4
            );
  rep_arg_set._M_dataplus._M_p._0_4_ = 0x40;
  rep_arg_set_done._M_dataplus._M_p._0_4_ = 0x12;
  local_1e0[0] = MEM_RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&rep_arg_set,(operand *)&rep_arg_set_done,local_1e0);
  rep_arg_set._M_dataplus._M_p._0_4_ = 5;
  rep_arg_set_done._M_dataplus._M_p._0_4_ = 0x14;
  local_1e0[0] = NUMBER;
  local_1e4 = CH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&rep_arg_set,(operand *)&rep_arg_set_done,local_1e0,(int *)&local_1e4
            );
  rep_arg_set._M_dataplus._M_p._0_4_ = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&rep_arg_set,&all_args_set);
  rep_arg_set._M_dataplus._M_p._0_4_ = 0;
  rep_arg_set_done._M_dataplus._M_p._0_4_ = 9;
  local_1e0[0] = NUMBER;
  local_1e4 = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&rep_arg_set,(operand *)&rep_arg_set_done,local_1e0,(int *)&local_1e4
            );
  rep_arg_set._M_dataplus._M_p._0_4_ = 0x40;
  rep_arg_set_done._M_dataplus._M_p._0_4_ = 0x15;
  local_1e0[0] = MEM_RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&rep_arg_set,(operand *)&rep_arg_set_done,local_1e0);
  rep_arg_set._M_dataplus._M_p._0_4_ = 5;
  rep_arg_set_done._M_dataplus._M_p._0_4_ = 0x14;
  local_1e0[0] = NUMBER;
  local_1e4 = DL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&rep_arg_set,(operand *)&rep_arg_set_done,local_1e0,(int *)&local_1e4
            );
  rep_arg_set._M_dataplus._M_p._0_4_ = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&rep_arg_set,&all_args_set);
  rep_arg_set._M_dataplus._M_p._0_4_ = 0;
  rep_arg_set_done._M_dataplus._M_p._0_4_ = 9;
  local_1e0[0] = NUMBER;
  local_1e4 = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&rep_arg_set,(operand *)&rep_arg_set_done,local_1e0,(int *)&local_1e4
            );
  rep_arg_set._M_dataplus._M_p._0_4_ = 0x40;
  rep_arg_set_done._M_dataplus._M_p._0_4_ = 0x17;
  local_1e0[0] = MEM_RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,(operation *)&rep_arg_set,(operand *)&rep_arg_set_done,local_1e0);
  rep_arg_set._M_dataplus._M_p._0_4_ = 5;
  rep_arg_set_done._M_dataplus._M_p._0_4_ = 0x14;
  local_1e0[0] = NUMBER;
  local_1e4 = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&rep_arg_set,(operand *)&rep_arg_set_done,local_1e0,(int *)&local_1e4
            );
  rep_arg_set._M_dataplus._M_p._0_4_ = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&rep_arg_set,&all_args_set);
  rep_arg_set._M_dataplus._M_p._0_4_ = 0x4b;
  rep_arg_set_done._M_dataplus._M_p._0_4_ = 0x14;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&rep_arg_set,(operand *)&rep_arg_set_done);
  rep_arg_set._M_dataplus._M_p._0_4_ = 0x58;
  rep_arg_set_done._M_dataplus._M_p._0_4_ = 0x14;
  local_1e0[0] = NUMBER;
  local_1e4 = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&rep_arg_set,(operand *)&rep_arg_set_done,local_1e0,(int *)&local_1e4
            );
  rep_arg_set._M_dataplus._M_p._0_4_ = 0x40;
  rep_arg_set_done._M_dataplus._M_p._0_4_ = 0x18;
  local_1e0[0] = MEM_R10;
  local_1e4 = 0x88;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&rep_arg_set,(operand *)&rep_arg_set_done,local_1e0,(int *)&local_1e4
            );
  rep_arg_set._M_dataplus._M_p._0_4_ = 0x4b;
  rep_arg_set_done._M_dataplus._M_p._0_4_ = 0xb;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&rep_arg_set,(operand *)&rep_arg_set_done);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&rep_arg_set,psVar1,lab_09);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&rep_arg_set_done,psVar1,lab_10);
  local_1e0[0] = ST4;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_1e0,&rep_arg_set);
  local_1e0[0] = EMPTY;
  local_1e4 = RAX;
  local_174 = NUMBER;
  local_10c = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_1e0,&local_1e4,&local_174,(int *)&local_10c);
  local_1e0[0] = ST6;
  local_1e4 = RCX;
  local_174 = MEM_RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_1e0,&local_1e4,&local_174);
  local_1e0[0] = ST6;
  local_1e4 = MEM_R15;
  local_174 = RCX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_1e0,&local_1e4,&local_174);
  local_1e0[0] = EMPTY;
  local_1e4 = R15;
  local_174 = NUMBER;
  local_10c = DH;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_1e0,&local_1e4,&local_174,(int *)&local_10c);
  local_1e0[0] = RSI;
  local_1e4 = R11;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_1e0,&local_1e4);
  local_1e0[0] = CL;
  local_1e4 = R11;
  local_174 = NUMBER;
  local_10c = EMPTY;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_1e0,&local_1e4,&local_174,(int *)&local_10c);
  local_1e0[0] = BYTE_MEM_R15;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_1e0,&rep_arg_set_done);
  local_1e0[0] = BYTE_MEM_R12;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_1e0,&rep_arg_set);
  local_1e0[0] = ST4;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_1e0,&rep_arg_set_done);
  local_1e0[0] = XMM7;
  local_1e4 = RCX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_1e0,&local_1e4);
  local_1e0[0] = XMM7;
  local_1e4 = R11;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_1e0,&local_1e4);
  local_1e0[0] = ST4;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_1e0,&all_args_set);
  local_1e0[0] = ST6;
  local_1e4 = RAX;
  local_174 = MEM_R10;
  local_10c = 0xa0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_1e0,&local_1e4,&local_174,(int *)&local_10c);
  local_1e0[0] = 0x40;
  local_1e4 = R15;
  local_174 = MEM_RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_1e0,&local_1e4,&local_174);
  local_1e4 = AH;
  local_174 = R15;
  local_10c = NUMBER;
  local_1e0[0] = ~DL;
  local_1e0[1] = ~EMPTY;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,&local_1e4,&local_174,&local_10c,(unsigned_long *)local_1e0);
  local_1e0[0] = 0x2c;
  local_1e4 = R15;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_1e0,&local_1e4);
  if (ops->safe_primitives == true) {
    error_label(code,&error,re_apply_contract_violation);
  }
  std::__cxx11::string::~string((string *)&rep_arg_set_done);
  std::__cxx11::string::~string((string *)&rep_arg_set);
  std::__cxx11::string::~string((string *)&all_args_set);
  std::__cxx11::string::~string((string *)&rep_arg_set_clos_done);
  std::__cxx11::string::~string((string *)&rep_arg_set_clos);
  std::__cxx11::string::~string((string *)&all_args_set_clos);
  std::__cxx11::string::~string((string *)&unraveled);
  std::__cxx11::string::~string((string *)&unravel);
  std::__cxx11::string::~string((string *)&done);
  std::__cxx11::string::~string((string *)&repeat);
  std::__cxx11::string::~string((string *)&clos);
  std::__cxx11::string::~string((string *)&proc);
  std::__cxx11::string::~string((string *)&error);
  return;
}

Assistant:

void compile_apply(asmcode& code, const compiler_options& ops)
  {
  std::string error;
  std::string proc = label_to_string(label++);
  std::string clos = label_to_string(label++);
  if (ops.safe_primitives)
    {
    error = label_to_string(label++);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 2);
    code.add(asmcode::JL, error);
    }

  //we move all registers in GC_SAVE, then all args are linear in memory (GC_SAVE is followed by LOCALS)
  code.add(asmcode::MOV, asmcode::RAX, GC_SAVE);
  code.add(asmcode::MOV, asmcode::MEM_RAX, asmcode::RCX);
  code.add(asmcode::MOV, asmcode::MEM_RAX, CELLS(1), asmcode::RDX);
  code.add(asmcode::MOV, asmcode::MEM_RAX, CELLS(2), asmcode::RSI);
  code.add(asmcode::MOV, asmcode::MEM_RAX, CELLS(3), asmcode::RDI);
  code.add(asmcode::MOV, asmcode::MEM_RAX, CELLS(4), asmcode::R8);
  code.add(asmcode::MOV, asmcode::MEM_RAX, CELLS(5), asmcode::R9);
  code.add(asmcode::MOV, asmcode::MEM_RAX, CELLS(6), asmcode::R12);
  code.add(asmcode::MOV, asmcode::MEM_RAX, CELLS(7), asmcode::R14);

  code.add(asmcode::MOV, asmcode::RDX, asmcode::R11); // save r11 in rdx

  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1)); // mem_rax now points to rdx = 2nd arg
  code.add(asmcode::SUB, asmcode::R11, asmcode::NUMBER, 2);

  //now we look for the last argument, which should be a list
  std::string repeat = label_to_string(label++);
  std::string done = label_to_string(label++);
  code.add(asmcode::LABEL, repeat);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 0);
  code.add(asmcode::JES, done); // last arg found, is in mem_rax
  code.add(asmcode::DEC, asmcode::R11);
  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::JMPS, repeat);
  code.add(asmcode::LABEL, done);

  std::string unravel = label_to_string(label++);
  std::string unraveled = label_to_string(label++);

  code.add(asmcode::MOV, asmcode::R11, asmcode::RDX); // get length again
  code.add(asmcode::SUB, asmcode::R11, asmcode::NUMBER, 2);
  // mem_rax now contains a list, let's check
  code.add(asmcode::MOV, asmcode::R15, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R15, asmcode::NUMBER, nil); // last element is nil, so that's fine
  code.add(asmcode::JE, unraveled);
  if (ops.safe_primitives)
    jump_if_arg_is_not_block(code, asmcode::R15, asmcode::RDX, error);
  code.add(asmcode::AND, asmcode::R15, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  if (ops.safe_primitives)
    jump_if_arg_does_not_point_to_pair(code, asmcode::R15, asmcode::RDX, error);

  code.add(asmcode::LABEL, unravel);
  code.add(asmcode::MOV, asmcode::RDX, asmcode::MEM_R15, CELLS(1)); // get car of pair in rdx
  code.add(asmcode::MOV, asmcode::MEM_RAX, asmcode::RDX);
  code.add(asmcode::INC, asmcode::R11);
  code.add(asmcode::MOV, asmcode::RDX, asmcode::MEM_R15, CELLS(2)); // get cdr of pair in rdx
  code.add(asmcode::CMP, asmcode::RDX, asmcode::NUMBER, nil); // last element is nil, so all elements are unpacked
  code.add(asmcode::JE, unraveled);
  if (ops.safe_primitives)
    jump_if_arg_is_not_block(code, asmcode::RDX, asmcode::R15, error);
  code.add(asmcode::AND, asmcode::RDX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  if (ops.safe_primitives)
    jump_if_arg_does_not_point_to_pair(code, asmcode::RDX, asmcode::R15, error);
  code.add(asmcode::MOV, asmcode::R15, asmcode::RDX);
  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::JMPS, unravel);
  code.add(asmcode::LABEL, unraveled);


  code.add(asmcode::MOV, asmcode::RAX, asmcode::RCX);
  code.add(asmcode::AND, asmcode::RAX, asmcode::NUMBER, procedure_mask);
  code.add(asmcode::CMP, asmcode::RAX, asmcode::NUMBER, procedure_tag);
  code.add(asmcode::JE, proc);
  if (ops.safe_primitives)
    {
    jump_if_arg_is_not_block(code, asmcode::RCX, asmcode::R15, error);
    code.add(asmcode::AND, asmcode::RCX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
    jump_if_arg_does_not_point_to_closure(code, asmcode::RCX, asmcode::R15, error);
    code.add(asmcode::OR, asmcode::RCX, asmcode::NUMBER, block_tag); // add block tag again
    }
  // if we are here, then the apply is on a closure in rcx

  //first we make a fake cps object
  // todo: move this to the context. We don't need to create one each apply. We could reserve memory for it in the context
  code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, 1);
  code.add(asmcode::MOV, asmcode::R15, asmcode::NUMBER, (uint64_t)closure_tag << (uint64_t)block_shift);
  code.add(asmcode::OR, asmcode::RAX, asmcode::R15);
  code.add(asmcode::MOV, MEM_ALLOC, asmcode::RAX);
  code.add(asmcode::MOV, asmcode::R15, asmcode::LABELADDRESS, "L_identity");
  code.add(asmcode::MOV, MEM_ALLOC, CELLS(1), asmcode::R15);
  code.add(asmcode::MOV, asmcode::R15, ALLOC);
  code.add(asmcode::OR, asmcode::R15, asmcode::NUMBER, block_tag);
  code.add(asmcode::ADD, ALLOC, asmcode::NUMBER, CELLS(2));

  //rcx is ok, it contains the closure
  code.add(asmcode::MOV, asmcode::RDX, asmcode::R15); // the cps object in rdx

  auto all_args_set_clos = label_to_string(label++);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 0);
  code.add(asmcode::JE, all_args_set_clos);
  code.add(asmcode::MOV, asmcode::RAX, GC_SAVE);
  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::RSI, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 1);
  code.add(asmcode::JE, all_args_set_clos);

  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::RDI, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 2);
  code.add(asmcode::JE, all_args_set_clos);

  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::R8, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 3);
  code.add(asmcode::JE, all_args_set_clos);

  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::R9, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 4);
  code.add(asmcode::JE, all_args_set_clos);

  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::R12, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 5);
  code.add(asmcode::JE, all_args_set_clos);

  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::R14, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 6);
  code.add(asmcode::JE, all_args_set_clos);

  code.add(asmcode::PUSH, asmcode::R11);
  code.add(asmcode::SUB, asmcode::R11, asmcode::NUMBER, 6);
  code.add(asmcode::MOV, asmcode::R15, LOCAL);
  /*
  We have to go from the end to the front, as we'll otherwise overwrite data we still need, as GC_SAVE and LOCAL are next to each other in memory
  */
  code.add(asmcode::SHL, asmcode::R11, asmcode::NUMBER, 3);
  code.add(asmcode::ADD, asmcode::R15, asmcode::R11);
  code.add(asmcode::ADD, asmcode::RAX, asmcode::R11);
  code.add(asmcode::SHR, asmcode::R11, asmcode::NUMBER, 3);
  code.add(asmcode::PUSH, asmcode::RCX);

  auto rep_arg_set_clos = label_to_string(label++);
  auto rep_arg_set_clos_done = label_to_string(label++);
  code.add(asmcode::LABEL, rep_arg_set_clos);
  code.add(asmcode::SUB, asmcode::R15, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::RCX, asmcode::MEM_RAX);
  code.add(asmcode::MOV, asmcode::MEM_R15, asmcode::RCX);
  code.add(asmcode::SUB, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::DEC, asmcode::R11);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 0);
  code.add(asmcode::JES, rep_arg_set_clos_done);
  code.add(asmcode::JMPS, rep_arg_set_clos);
  code.add(asmcode::LABEL, rep_arg_set_clos_done);
  code.add(asmcode::POP, asmcode::RCX);
  code.add(asmcode::POP, asmcode::R11);
  code.add(asmcode::LABEL, all_args_set_clos);
  code.add(asmcode::ADD, asmcode::R11, asmcode::NUMBER, 2);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::RCX);
  code.add(asmcode::AND, asmcode::RAX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  code.add(asmcode::MOV, asmcode::R15, asmcode::MEM_RAX, CELLS(1));

  code.add(asmcode::PUSH, CONTINUE);
  code.add(asmcode::JMP, asmcode::R15); // call closure  
  code.add(asmcode::LABEL, "L_return_from_identity");

  code.add(asmcode::POP, CONTINUE);
  code.add(asmcode::JMP, CONTINUE);
  code.add(asmcode::LABEL, proc);
  // if we are here, then the apply is on a procedure in rcx

  auto all_args_set = label_to_string(label++);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 0);
  code.add(asmcode::JE, all_args_set);
  code.add(asmcode::MOV, asmcode::RAX, GC_SAVE);
  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::RCX, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 1);
  code.add(asmcode::JE, all_args_set);
  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::RDX, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 2);
  code.add(asmcode::JE, all_args_set);

  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::RSI, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 3);
  code.add(asmcode::JE, all_args_set);

  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::RDI, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 4);
  code.add(asmcode::JE, all_args_set);

  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::R8, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 5);
  code.add(asmcode::JE, all_args_set);

  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::R9, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 6);
  code.add(asmcode::JE, all_args_set);

  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::R12, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 7);
  code.add(asmcode::JE, all_args_set);

  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::R14, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 8);
  code.add(asmcode::JE, all_args_set);

  code.add(asmcode::PUSH, asmcode::R11);
  code.add(asmcode::SUB, asmcode::R11, asmcode::NUMBER, 8);
  code.add(asmcode::MOV, asmcode::R15, LOCAL);
  code.add(asmcode::PUSH, asmcode::RCX);
  /*
  We have to go from the front to the end (as opposed to the case for closures above), as we'll otherwise overwrite data we still need, as GC_SAVE and LOCAL are next to each other in memory
  */
  auto rep_arg_set = label_to_string(label++);
  auto rep_arg_set_done = label_to_string(label++);
  code.add(asmcode::LABEL, rep_arg_set);
  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::RCX, asmcode::MEM_RAX);
  code.add(asmcode::MOV, asmcode::MEM_R15, asmcode::RCX);
  code.add(asmcode::ADD, asmcode::R15, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::DEC, asmcode::R11);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 0);
  code.add(asmcode::JES, rep_arg_set_done);
  code.add(asmcode::JMPS, rep_arg_set);
  code.add(asmcode::LABEL, rep_arg_set_done);
  code.add(asmcode::POP, asmcode::RCX);
  code.add(asmcode::POP, asmcode::R11);
  code.add(asmcode::LABEL, all_args_set);
  code.add(asmcode::MOV, asmcode::RAX, GC_SAVE);
  code.add(asmcode::MOV, asmcode::R15, asmcode::MEM_RAX);
  code.add(asmcode::AND, asmcode::R15, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8); // get procedure address
  code.add(asmcode::JMP, asmcode::R15); // call primitive

  if (ops.safe_primitives)
    {
    error_label(code, error, re_apply_contract_violation);
    }
  }